

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

path * boost::filesystem::detail::weakly_canonical
                 (path *__return_storage_ptr__,path *p,error_code *ec)

{
  int iVar1;
  path *ppVar2;
  size_type sVar3;
  path *ppVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  path head;
  error_code tmp_ec;
  file_status head_status;
  path tail;
  iterator itr;
  path local_e0;
  error_code local_c0;
  path local_b0;
  path *local_90;
  size_type local_88;
  path local_80;
  iterator local_60;
  
  std::__cxx11::string::string((string *)&local_e0,(string *)p);
  local_80.m_pathname._M_dataplus._M_p = (pointer)&local_80.m_pathname.field_2;
  local_80.m_pathname._M_string_length = 0;
  local_80.m_pathname.field_2._M_local_buf[0] = '\0';
  local_c0.m_val = 0;
  local_c0.m_cat = system::system_category();
  path::end(p);
  while (local_e0.m_pathname._M_string_length != 0) {
    status((detail *)&local_b0,&local_e0,&local_c0);
    iVar1 = (int)local_b0.m_pathname._M_dataplus._M_p;
    bVar6 = anon_unknown.dwarf_54f5::error
                      ((uint)((int)local_b0.m_pathname._M_dataplus._M_p == 0),&local_e0,ec,
                       "boost::filesystem::weakly_canonical");
    if (bVar6) goto LAB_0010d705;
    if (iVar1 != 1) break;
    path::remove_filename(&local_e0);
    path::m_path_iterator_decrement(&local_60);
  }
  bVar6 = false;
  while( true ) {
    path::end(p);
    sVar5 = local_60.m_pos;
    ppVar4 = local_60.m_path_ptr;
    sVar3 = local_88;
    ppVar2 = local_90;
    std::__cxx11::string::~string((string *)&local_b0);
    if ((ppVar4 == ppVar2) && (sVar5 == sVar3)) break;
    path::operator/=(&local_80,&local_60.m_element);
    if (((local_60.m_element.m_pathname._M_string_length < 3) &&
        (*local_60.m_element.m_pathname._M_dataplus._M_p == '.')) &&
       ((local_60.m_element.m_pathname._M_string_length == 1 ||
        (local_60.m_element.m_pathname._M_dataplus._M_p[1] == '.')))) {
      bVar6 = true;
    }
    path::m_path_iterator_increment(&local_60);
  }
  if (local_e0.m_pathname._M_string_length == 0) {
    path::lexically_normal(__return_storage_ptr__,p);
  }
  else {
    filesystem::canonical(&local_b0,&local_e0,&local_c0);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar7 = anon_unknown.dwarf_54f5::error
                      (local_c0.m_val,&local_e0,ec,"boost::filesystem::weakly_canonical");
    if (bVar7) {
LAB_0010d705:
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_pathname).field_2;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    }
    else if (local_80.m_pathname._M_string_length == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_e0);
    }
    else if (bVar6) {
      operator/(&local_b0,&local_e0,&local_80);
      path::lexically_normal(__return_storage_ptr__,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      operator/(__return_storage_ptr__,&local_e0,&local_80);
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path weakly_canonical(const path& p, system::error_code* ec)
  {
    path head(p);
    path tail;
    system::error_code tmp_ec;
    path::iterator itr = p.end();

    for (; !head.empty(); --itr)
    {
      file_status head_status = status(head, tmp_ec);
      if (error(head_status.type() == fs::status_error,
        head, ec, "boost::filesystem::weakly_canonical"))
        return path();
      if (head_status.type() != fs::file_not_found)
        break;
      head.remove_filename();
    }

    bool tail_has_dots = false;
    for (; itr != p.end(); ++itr)
    { 
      tail /= *itr;
      // for a later optimization, track if any dot or dot-dot elements are present
      if (itr->native().size() <= 2
        && itr->native()[0] == dot
        && (itr->native().size() == 1 || itr->native()[1] == dot))
        tail_has_dots = true;
    }
    
    if (head.empty())
      return p.lexically_normal();
    head = canonical(head, tmp_ec);
    if (error(tmp_ec.value(), head, ec, "boost::filesystem::weakly_canonical"))
      return path();
    return tail.empty()
      ? head
      : (tail_has_dots  // optimization: only normalize if tail had dot or dot-dot element
          ? (head/tail).lexically_normal()  
          : head/tail);
  }